

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverVI.cpp
# Opt level: O1

void __thiscall
chrono::ChIterativeSolverVI::AtIterationEnd
          (ChIterativeSolverVI *this,double mmaxviolation,double mdeltalambda,uint iternum)

{
  pointer pdVar1;
  pointer pdVar2;
  iterator iVar3;
  ulong __new_size;
  double local_30;
  double local_28;
  
  if (this->record_violation_history == true) {
    __new_size = (ulong)iternum;
    pdVar1 = (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_30 = mdeltalambda;
    local_28 = mmaxviolation;
    if ((long)pdVar2 - (long)pdVar1 >> 3 != __new_size) {
      if (pdVar2 != pdVar1) {
        (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar1;
      }
      std::vector<double,_std::allocator<double>_>::resize(&this->violation_history,__new_size);
    }
    pdVar1 = (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pdVar2 - (long)pdVar1 >> 3 != __new_size) {
      if (pdVar2 != pdVar1) {
        (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar1;
      }
      std::vector<double,_std::allocator<double>_>::resize(&this->dlambda_history,__new_size);
    }
    iVar3._M_current =
         (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->violation_history,iVar3,&local_28);
    }
    else {
      *iVar3._M_current = local_28;
      (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    iVar3._M_current =
         (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->dlambda_history,iVar3,&local_30);
    }
    else {
      *iVar3._M_current = local_30;
      (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
  }
  return;
}

Assistant:

void ChIterativeSolverVI::AtIterationEnd(double mmaxviolation, double mdeltalambda, unsigned int iternum) {
    if (!record_violation_history)
        return;
    if (iternum != violation_history.size()) {
        violation_history.clear();
        violation_history.resize(iternum);
    }
    if (iternum != dlambda_history.size()) {
        dlambda_history.clear();
        dlambda_history.resize(iternum);
    }
    violation_history.push_back(mmaxviolation);
    dlambda_history.push_back(mdeltalambda);
}